

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_integer(void)

{
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  char *pcVar6;
  wchar16 *pwVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  Status myStatus;
  StrX local_258;
  Status myStatus_14;
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char data_canrep_2 [6];
  char data_canrep_1 [6];
  char data_rawstr_2 [9];
  char lex_v_ran64_iv_2 [21];
  char lex_v_ran64_iv_1 [21];
  char lex_v_ran64_v_2 [21];
  char lex_v_ran64_v_1 [21];
  char data_rawstr_1 [14];
  char lex_v_ran_v_1 [13];
  char lex_v_ran64_iv_1_canrep [20];
  char lex_v_ran64_v_1_canrep [20];
  char lex_v_ran64_iv_2_canrep [21];
  char lex_v_ran64_v_2_canrep [21];
  undefined8 local_f0;
  undefined8 local_c8;
  undefined8 local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  int iVar11;
  
  builtin_strncpy(lex_v_ran_v_1 + 8,"   \n",5);
  builtin_strncpy(lex_v_ran_v_1,"   1234 ",8);
  builtin_strncpy(lex_v_ran64_v_1,"+9223372036854775807",0x15);
  builtin_strncpy(lex_v_ran64_v_2,"-9223372036854775808",0x15);
  builtin_strncpy(lex_v_ran64_iv_1,"+9223372036854775808",0x15);
  builtin_strncpy(lex_v_ran64_iv_2 + 0x10,"5809",5);
  builtin_strncpy(lex_v_ran64_iv_2,"-922337203685477",0x10);
  builtin_strncpy(lex_v_ran64_v_1_canrep,"9223372036854775807",0x14);
  builtin_strncpy(lex_v_ran64_v_2_canrep + 0x10,"5808",5);
  builtin_strncpy(lex_v_ran64_v_2_canrep,"-922337203685477",0x10);
  builtin_strncpy(lex_v_ran64_iv_1_canrep,"9223372036854775808",0x14);
  builtin_strncpy(lex_v_ran64_iv_2_canrep + 0x10,"5809",5);
  builtin_strncpy(lex_v_ran64_iv_2_canrep,"-922337203685477",0x10);
  builtin_strncpy(lex_iv_1,"12b34.456",10);
  builtin_strncpy(lex_iv_2,"1234b56",8);
  builtin_strncpy(data_rawstr_1 + 8,"5   \n",6);
  builtin_strncpy(data_rawstr_1,"   +1234",8);
  builtin_strncpy(data_canrep_1,"12345",6);
  builtin_strncpy(data_rawstr_2,"00012345",9);
  builtin_strncpy(data_canrep_2,"12345",6);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran_v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x557,lex_v_ran_v_1,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran64_v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x558,lex_v_ran64_v_1,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran64_v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x559,lex_v_ran64_v_2,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran64_iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55a,lex_v_ran64_iv_1,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_v_ran64_iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55b,lex_v_ran64_iv_2,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pcVar1 = local_258.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x55e,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_00109ba5;
    }
  }
  else {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55e,lex_iv_1,local_258.fLocalForm,0);
LAB_00109ba5:
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    if (myStatus == st_FOCA0002) goto LAB_00109c83;
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    pcVar1 = local_258.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x55f,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
  }
  else {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55f,lex_iv_2,local_258.fLocalForm,0);
  }
  StrX::~StrX(&local_258);
  errSeen = 1;
LAB_00109c83:
  iVar11 = 2;
  while (iVar10 = iVar11 + -1, iVar11 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_v_ran_v_1);
    pvVar9 = (void *)0x1f;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57c,lex_v_ran_v_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      expValue.fValue.f_long = 0x4d2;
      expValue._0_8_ = local_a0;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar3 = compareActualValue(dt_integer,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_v_ran64_v_1);
    pvVar9 = (void *)0x1f;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57e,lex_v_ran64_v_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      expValue_00.fValue.f_long = 0x7fffffffffffffff;
      expValue_00._0_8_ = local_c8;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar3 = compareActualValue(dt_integer,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_v_ran64_v_2);
    pvVar9 = (void *)0x1f;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57f,lex_v_ran64_v_2);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      expValue_01.fValue.f_long = 0x8000000000000000;
      expValue_01._0_8_ = local_f0;
      expValue_01.fValue._8_8_ = local_78;
      expValue_01.fValue._16_8_ = uStack_70;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_68;
      bVar3 = compareActualValue(dt_integer,*pXVar4,expValue_01);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_v_ran64_iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0003) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar1 = local_258.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x580,lex_v_ran64_iv_1,pcVar1,"st_FOCA0003",pcVar6);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar9 = (void *)0x580;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x580,lex_v_ran64_iv_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_v_ran64_iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0003) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar1 = local_258.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x581,lex_v_ran64_iv_2,pcVar1,"st_FOCA0003",pcVar6);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar9 = (void *)0x581;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x581,lex_v_ran64_iv_2);
      StrX::~StrX(&local_258);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar1 = local_258.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x583,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar9 = (void *)0x583;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x583,lex_iv_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_258,lex_iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    iVar11 = iVar10;
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        pcVar1 = local_258.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x584,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pvVar9 = (void *)0x584;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x584,lex_iv_2);
      StrX::~StrX(&local_258);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
  }
  iVar11 = 2;
LAB_0010a3e4:
  iVar10 = iVar11 + -1;
  if (iVar11 == 0) {
    return;
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_258,data_rawstr_1);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_integer,&myStatus_14,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x5a2,data_rawstr_1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_1);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x5a2,data_rawstr_1,local_258.fLocalForm,_myStatus,data_canrep_1);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_258,data_rawstr_2);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_integer,&myStatus_14,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x5a3,data_rawstr_2);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_2);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x5a3,data_rawstr_2,local_258.fLocalForm,_myStatus,data_canrep_2);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_258,lex_v_ran64_v_1);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_integer,&myStatus_14,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x5a5,lex_v_ran64_v_1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran64_v_1_canrep);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x5a5,lex_v_ran64_v_1,local_258.fLocalForm,_myStatus,lex_v_ran64_v_1_canrep);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_258,lex_v_ran64_v_2);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_integer,&myStatus_14,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x5a6,lex_v_ran64_v_2);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran64_v_2_canrep);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x5a6,lex_v_ran64_v_2,local_258.fLocalForm,_myStatus,lex_v_ran64_v_2_canrep);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_258,lex_v_ran64_iv_1);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_integer,&myStatus_14,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x5a7,lex_v_ran64_iv_1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran64_iv_1_canrep);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x5a7,lex_v_ran64_iv_1,local_258.fLocalForm,_myStatus,lex_v_ran64_iv_1_canrep);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  myStatus_14 = st_Init;
  StrX::StrX(&local_258,lex_v_ran64_iv_2);
  pwVar7 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_258.fUnicodeForm,dt_integer,&myStatus_14,ver_10,iVar11 == 2,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (pwVar7 == (wchar16 *)0x0) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x5a8,lex_v_ran64_iv_2);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  else {
    _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran64_iv_2_canrep);
    if (!bVar3) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x5a8,lex_v_ran64_iv_2,local_258.fLocalForm,_myStatus,lex_v_ran64_iv_2_canrep);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
    xercesc_4_0::XMLString::release
              ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_iv_1);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (lVar8 == 0) {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
      pcVar1 = local_258.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x5a9,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
      StrX::~StrX(&local_258);
      goto LAB_0010ab72;
    }
  }
  else {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x5a9,lex_iv_1);
    StrX::~StrX(&local_258);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0010ab72:
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_258,lex_iv_2);
  lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_258.fUnicodeForm,dt_integer,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  iVar11 = iVar10;
  if (lVar8 == 0) goto LAB_0010ac03;
  StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0x5aa,lex_iv_2);
  StrX::~StrX(&local_258);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
  goto LAB_0010ac54;
LAB_0010ac03:
  if (myStatus != st_FOCA0002) {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    pcVar1 = local_258.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x5aa,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
    StrX::~StrX(&local_258);
LAB_0010ac54:
    errSeen = 1;
  }
  goto LAB_0010a3e4;
}

Assistant:

void test_dt_integer()
{
    const XSValue::DataType dt = XSValue::dt_integer;
    bool  toValidate = true;

    const char lex_v_ran_v_1[]="   1234    \n";
    const char lex_v_ran64_v_1[]="+9223372036854775807";
    const char lex_v_ran64_v_2[]="-9223372036854775808";
    const char lex_v_ran64_iv_1[]="+9223372036854775808";
    const char lex_v_ran64_iv_2[]="-9223372036854775809";

    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_long = (int64_t)1234ll;
    XSValue::XSValue_Data act_v_ran64_v_1; act_v_ran64_v_1.fValue.f_long = (int64_t)+9223372036854775807ll;
    XSValue::XSValue_Data act_v_ran64_v_2; act_v_ran64_v_2.fValue.f_long = (int64_t)-9223372036854775808ll;
    XSValue::XSValue_Data act_v_ran32_v_1; act_v_ran32_v_1.fValue.f_long = (int64_t)+2147483647ll;
    XSValue::XSValue_Data act_v_ran32_v_2; act_v_ran32_v_2.fValue.f_long = (int64_t)-2147483648ll;

    const char lex_v_ran64_v_1_canrep[]="9223372036854775807";
    const char lex_v_ran64_v_2_canrep[]="-9223372036854775808";
    const char lex_v_ran64_iv_1_canrep[]="9223372036854775808";
    const char lex_v_ran64_iv_2_canrep[]="-9223372036854775809";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.13.2 Canonical representation
 *
 * The canonical representation for integer is defined by prohibiting certain options from the Lexical
 * representation (3.3.13.1). Specifically,
 * 1. the preceding optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid       n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_ran_v_1    , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_1,    dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);

        ACTVALUE_TEST(lex_v_ran64_v_1 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_v_2 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_2);
        ACTVALUE_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_1);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran64_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_2_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_2_canrep, DONT_CARE);
        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

}